

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ReflectionTester
          (ReflectionTester *this,Descriptor *base_descriptor)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  bool bVar1;
  FileDescriptor *pFVar2;
  FieldDescriptor *pFVar3;
  Descriptor *this_00;
  EnumValueDescriptor *pEVar4;
  char *pcVar5;
  Descriptor *b;
  char *in_R9;
  string local_ff0;
  AssertHelper local_fd0;
  Message local_fc8;
  bool local_fb9;
  undefined1 local_fb8 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_f88;
  Message local_f80;
  bool local_f71;
  undefined1 local_f70 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_f40;
  Message local_f38;
  bool local_f29;
  undefined1 local_f28 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_ef8;
  Message local_ef0;
  bool local_ee1;
  undefined1 local_ee0 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_eb0;
  Message local_ea8;
  bool local_e99;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_e68;
  Message local_e60;
  bool local_e51;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_e20;
  Message local_e18;
  bool local_e09;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_dd8;
  Message local_dd0;
  bool local_dc1;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_d90;
  Message local_d88;
  bool local_d79;
  undefined1 local_d78 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_d48;
  Message local_d40;
  bool local_d31;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_d00;
  Message local_cf8;
  bool local_ce9;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_cb8;
  Message local_cb0;
  bool local_ca1;
  undefined1 local_ca0 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_c70;
  Message local_c68;
  bool local_c59;
  undefined1 local_c58 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_c28;
  Message local_c20;
  bool local_c11;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_be0;
  Message local_bd8;
  bool local_bc9;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_;
  AlphaNum local_b78;
  string local_b48;
  string_view local_b28;
  AlphaNum local_b18;
  FieldDescriptor *local_ae8;
  size_t sStack_ae0;
  AlphaNum local_ad8;
  string local_aa8;
  string_view local_a88;
  AlphaNum local_a78;
  FieldDescriptor *local_a48;
  size_t sStack_a40;
  AlphaNum local_a38;
  string local_a08;
  string_view local_9e8;
  AlphaNum local_9d8;
  FieldDescriptor *local_9a8;
  size_t sStack_9a0;
  AlphaNum local_998;
  string local_968;
  string_view local_948;
  basic_string_view<char,_std::char_traits<char>_> local_938;
  basic_string_view<char,_std::char_traits<char>_> local_928;
  AlphaNum local_918;
  size_t local_8e8;
  size_t sStack_8e0;
  AlphaNum local_8d8;
  string local_8a8;
  string_view local_888;
  AlphaNum local_878;
  size_t local_848;
  size_t sStack_840;
  AlphaNum local_838;
  string local_808;
  string_view local_7e8;
  AlphaNum local_7d8;
  size_t local_7a8;
  size_t sStack_7a0;
  AlphaNum local_798;
  string local_768;
  string_view local_748;
  AlphaNum local_738;
  FieldDescriptor *local_708;
  size_t sStack_700;
  AlphaNum local_6f8;
  string local_6c8;
  string_view local_6a8;
  AlphaNum local_698;
  FieldDescriptor *local_668;
  size_t sStack_660;
  AlphaNum local_658;
  string local_628;
  string_view local_608;
  AlphaNum local_5f8;
  FieldDescriptor *local_5c8;
  size_t sStack_5c0;
  AlphaNum local_5b8;
  string local_588;
  string_view local_568;
  AlphaNum local_558;
  FieldDescriptor *local_528;
  size_t sStack_520;
  AlphaNum local_518;
  string local_4e8;
  string_view local_4c8;
  AlphaNum local_4b8;
  FieldDescriptor *local_488;
  size_t sStack_480;
  AlphaNum local_478;
  string local_448;
  string_view local_428;
  AlphaNum local_418;
  FieldDescriptor *local_3e8;
  size_t sStack_3e0;
  AlphaNum local_3d8;
  string local_3a8;
  string_view local_388;
  AlphaNum local_378;
  size_t local_348;
  size_t sStack_340;
  AlphaNum local_338;
  string local_308;
  string_view local_2e8;
  AlphaNum local_2d8;
  size_t local_2a8;
  size_t sStack_2a0;
  AlphaNum local_298;
  string local_268;
  string_view local_248;
  AlphaNum local_238;
  FieldDescriptor *local_208;
  size_t sStack_200;
  AlphaNum local_1f8;
  string local_1c8;
  string_view local_1a8;
  AlphaNum local_198;
  FieldDescriptor *local_168;
  size_t sStack_160;
  AlphaNum local_158;
  string local_128;
  string_view local_108;
  undefined1 auStack_f8 [8];
  string_view import_package;
  AlphaNum local_d8;
  FieldDescriptor *local_a8;
  size_t sStack_a0;
  AlphaNum local_98;
  string local_68;
  string_view local_48;
  FieldDescriptor *local_38;
  FieldDescriptor *import_descriptor;
  string_view package;
  DescriptorPool *pool;
  Descriptor *base_descriptor_local;
  ReflectionTester *this_local;
  
  this->base_descriptor_ = base_descriptor;
  b = base_descriptor;
  pFVar2 = Descriptor::file(base_descriptor);
  package._M_str = (char *)FileDescriptor::pool(pFVar2);
  pFVar2 = Descriptor::file(base_descriptor);
  _import_descriptor = FileDescriptor::package(pFVar2);
  pcVar5 = package._M_str;
  local_a8 = import_descriptor;
  sStack_a0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_98,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,".TestAllTypes.optional_import_message");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)&local_98,&local_d8,(AlphaNum *)b)
  ;
  local_48 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
  pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_48);
  std::__cxx11::string::~string((string *)&local_68);
  local_38 = pFVar3;
  this_00 = FieldDescriptor::message_type(pFVar3);
  pFVar2 = Descriptor::file(this_00);
  _auStack_f8 = FileDescriptor::package(pFVar2);
  pcVar5 = package._M_str;
  local_168 = import_descriptor;
  sStack_160 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_158,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_198,".TestAllTypes.NestedMessage.bb");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_128,(lts_20250127 *)&local_158,&local_198,(AlphaNum *)b);
  local_108 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_128);
  pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_108);
  this->nested_b_ = pFVar3;
  std::__cxx11::string::~string((string *)&local_128);
  pcVar5 = package._M_str;
  local_208 = import_descriptor;
  sStack_200 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1f8,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_238,".ForeignMessage.c");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_1c8,(lts_20250127 *)&local_1f8,&local_238,(AlphaNum *)pFVar3);
  local_1a8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1c8);
  pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_1a8);
  this->foreign_c_ = pFVar3;
  std::__cxx11::string::~string((string *)&local_1c8);
  pcVar5 = package._M_str;
  local_2a8 = (size_t)auStack_f8;
  sStack_2a0 = import_package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_298,_auStack_f8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,".ImportMessage.d");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_268,(lts_20250127 *)&local_298,&local_2d8,(AlphaNum *)pFVar3);
  local_248 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_268);
  pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_248);
  this->import_d_ = pFVar3;
  std::__cxx11::string::~string((string *)&local_268);
  pcVar5 = package._M_str;
  local_348 = (size_t)auStack_f8;
  sStack_340 = import_package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_338,_auStack_f8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_378,".PublicImportMessage.e");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_308,(lts_20250127 *)&local_338,&local_378,(AlphaNum *)pFVar3);
  local_2e8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_308);
  pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_2e8);
  this->import_e_ = pFVar3;
  std::__cxx11::string::~string((string *)&local_308);
  pcVar5 = package._M_str;
  local_3e8 = import_descriptor;
  sStack_3e0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_3d8,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_418,".TestAllTypes.FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_3a8,(lts_20250127 *)&local_3d8,&local_418,(AlphaNum *)pFVar3);
  local_388 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3a8);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_388);
  this->nested_foo_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_3a8);
  pcVar5 = package._M_str;
  local_488 = import_descriptor;
  sStack_480 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_478,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_4b8,".TestAllTypes.BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_448,(lts_20250127 *)&local_478,&local_4b8,(AlphaNum *)pEVar4);
  local_428 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_448);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_428);
  this->nested_bar_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_448);
  pcVar5 = package._M_str;
  local_528 = import_descriptor;
  sStack_520 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_518,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_558,".TestAllTypes.BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_4e8,(lts_20250127 *)&local_518,&local_558,(AlphaNum *)pEVar4);
  local_4c8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4e8);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_4c8);
  this->nested_baz_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_4e8);
  pcVar5 = package._M_str;
  local_5c8 = import_descriptor;
  sStack_5c0 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_5b8,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_5f8,".FOREIGN_FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_588,(lts_20250127 *)&local_5b8,&local_5f8,(AlphaNum *)pEVar4);
  local_568 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_588);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_568);
  this->foreign_foo_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_588);
  pcVar5 = package._M_str;
  local_668 = import_descriptor;
  sStack_660 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_658,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_698,".FOREIGN_BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_628,(lts_20250127 *)&local_658,&local_698,(AlphaNum *)pEVar4);
  local_608 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_628);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_608);
  this->foreign_bar_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_628);
  pcVar5 = package._M_str;
  local_708 = import_descriptor;
  sStack_700 = package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_6f8,_import_descriptor);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_738,".FOREIGN_BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_6c8,(lts_20250127 *)&local_6f8,&local_738,(AlphaNum *)pEVar4);
  local_6a8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_6c8);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_6a8);
  this->foreign_baz_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_6c8);
  pcVar5 = package._M_str;
  local_7a8 = (size_t)auStack_f8;
  sStack_7a0 = import_package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_798,_auStack_f8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_7d8,".IMPORT_FOO");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_768,(lts_20250127 *)&local_798,&local_7d8,(AlphaNum *)pEVar4);
  local_748 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_768);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_748);
  this->import_foo_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_768);
  pcVar5 = package._M_str;
  local_848 = (size_t)auStack_f8;
  sStack_840 = import_package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_838,_auStack_f8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_878,".IMPORT_BAR");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_808,(lts_20250127 *)&local_838,&local_878,(AlphaNum *)pEVar4);
  local_7e8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_808);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_7e8);
  this->import_bar_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_808);
  pcVar5 = package._M_str;
  local_8e8 = (size_t)auStack_f8;
  sStack_8e0 = import_package._M_len;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_8d8,_auStack_f8);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_918,".IMPORT_BAZ");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_8a8,(lts_20250127 *)&local_8d8,&local_918,(AlphaNum *)pEVar4);
  local_888 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_8a8);
  pEVar4 = DescriptorPool::FindEnumValueByName((DescriptorPool *)pcVar5,local_888);
  this->import_baz_ = pEVar4;
  std::__cxx11::string::~string((string *)&local_8a8);
  local_928 = Descriptor::name(this->base_descriptor_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_938,"TestAllExtensions");
  __y._M_str = local_938._M_str;
  __y._M_len = local_938._M_len;
  bVar1 = std::operator==(local_928,__y);
  pcVar5 = package._M_str;
  if (bVar1) {
    local_9a8 = import_descriptor;
    sStack_9a0 = package._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_998,_import_descriptor);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_9d8,".OptionalGroup_extension.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_968,(lts_20250127 *)&local_998,&local_9d8,(AlphaNum *)local_938._M_str);
    local_948 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_968);
    pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_948);
    this->group_a_ = pFVar3;
    std::__cxx11::string::~string((string *)&local_968);
    pcVar5 = package._M_str;
    local_a48 = import_descriptor;
    sStack_a40 = package._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a38,_import_descriptor);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a78,".RepeatedGroup_extension.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_a08,(lts_20250127 *)&local_a38,&local_a78,(AlphaNum *)pFVar3);
    local_9e8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a08);
    pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_9e8);
    this->repeated_group_a_ = pFVar3;
    std::__cxx11::string::~string((string *)&local_a08);
  }
  else {
    local_ae8 = import_descriptor;
    sStack_ae0 = package._M_len;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_ad8,_import_descriptor);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b18,".TestAllTypes.OptionalGroup.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_aa8,(lts_20250127 *)&local_ad8,&local_b18,(AlphaNum *)local_938._M_str);
    local_a88 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_aa8);
    pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_a88);
    this->group_a_ = pFVar3;
    std::__cxx11::string::~string((string *)&local_aa8);
    pcVar5 = package._M_str;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_b78,_import_descriptor);
    absl::lts_20250127::AlphaNum::AlphaNum
              ((AlphaNum *)&gtest_ar_.message_,".TestAllTypes.RepeatedGroup.a");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_b48,(lts_20250127 *)&local_b78,(AlphaNum *)&gtest_ar_.message_,
               (AlphaNum *)pFVar3);
    local_b28 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b48);
    pFVar3 = DescriptorPool::FindFieldByName((DescriptorPool *)pcVar5,local_b28);
    this->repeated_group_a_ = pFVar3;
    std::__cxx11::string::~string((string *)&local_b48);
  }
  local_bc9 = this->group_a_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_bc8,&local_bc9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
  if (!bVar1) {
    testing::Message::Message(&local_bd8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_bc8,(AssertionResult *)0x1d5b584,
               "false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_be0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x96,pcVar5);
    testing::internal::AssertHelper::operator=(&local_be0,&local_bd8);
    testing::internal::AssertHelper::~AssertHelper(&local_be0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_bd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
  local_c11 = this->repeated_group_a_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c10,&local_c11,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
  if (!bVar1) {
    testing::Message::Message(&local_c20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_c10,
               (AssertionResult *)"repeated_group_a_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x97,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c28,&local_c20);
    testing::internal::AssertHelper::~AssertHelper(&local_c28);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
  local_c59 = this->nested_b_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c58,&local_c59,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c58);
  if (!bVar1) {
    testing::Message::Message(&local_c68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_c58,
               (AssertionResult *)"nested_b_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x98,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c70,&local_c68);
    testing::internal::AssertHelper::~AssertHelper(&local_c70);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
  local_ca1 = this->foreign_c_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ca0,&local_ca1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca0);
  if (!bVar1) {
    testing::Message::Message(&local_cb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_ca0,
               (AssertionResult *)"foreign_c_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_cb8,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper(&local_cb8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca0);
  local_ce9 = this->import_d_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ce8,&local_ce9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar1) {
    testing::Message::Message(&local_cf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_ce8,
               (AssertionResult *)"import_d_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d00,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper(&local_d00);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  local_d31 = this->import_e_ != (FieldDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d30,&local_d31,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d30);
  if (!bVar1) {
    testing::Message::Message(&local_d40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_d30,
               (AssertionResult *)"import_e_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d48,&local_d40);
    testing::internal::AssertHelper::~AssertHelper(&local_d48);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
  local_d79 = this->nested_foo_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d78,&local_d79,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar1) {
    testing::Message::Message(&local_d88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_d78,
               (AssertionResult *)"nested_foo_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_d90,&local_d88);
    testing::internal::AssertHelper::~AssertHelper(&local_d90);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  local_dc1 = this->nested_bar_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dc0,&local_dc1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar1) {
    testing::Message::Message(&local_dd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_dc0,
               (AssertionResult *)"nested_bar_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_dd8,&local_dd0);
    testing::internal::AssertHelper::~AssertHelper(&local_dd8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_dd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  local_e09 = this->nested_baz_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e08,&local_e09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_e18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_e08,
               (AssertionResult *)"nested_baz_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e20,&local_e18);
    testing::internal::AssertHelper::~AssertHelper(&local_e20);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  local_e51 = this->foreign_foo_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e50,&local_e51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_e60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_e50,
               (AssertionResult *)"foreign_foo_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x9f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e68,&local_e60);
    testing::internal::AssertHelper::~AssertHelper(&local_e68);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_e99 = this->foreign_bar_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e98,&local_e99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_ea8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_e98,
               (AssertionResult *)"foreign_bar_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_eb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_eb0,&local_ea8);
    testing::internal::AssertHelper::~AssertHelper(&local_eb0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_ea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  local_ee1 = this->foreign_baz_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ee0,&local_ee1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee0);
  if (!bVar1) {
    testing::Message::Message(&local_ef0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_ee0,
               (AssertionResult *)"foreign_baz_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ef8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_ef8,&local_ef0);
    testing::internal::AssertHelper::~AssertHelper(&local_ef8);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_ef0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee0);
  local_f29 = this->import_foo_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f28,&local_f29,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f28);
  if (!bVar1) {
    testing::Message::Message(&local_f38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_f28,
               (AssertionResult *)"import_foo_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f40,&local_f38);
    testing::internal::AssertHelper::~AssertHelper(&local_f40);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_f38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f28);
  local_f71 = this->import_bar_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f70,&local_f71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f70);
  if (!bVar1) {
    testing::Message::Message(&local_f80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_f70,
               (AssertionResult *)"import_bar_ != nullptr","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f88,&local_f80);
    testing::internal::AssertHelper::~AssertHelper(&local_f88);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_f80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f70);
  local_fb9 = this->import_baz_ != (EnumValueDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fb8,&local_fb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb8);
  if (!bVar1) {
    testing::Message::Message(&local_fc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ff0,(internal *)local_fb8,(AssertionResult *)"import_baz_ != nullptr","false",
               "true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0xa4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_fd0,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_fd0);
    std::__cxx11::string::~string((string *)&local_ff0);
    testing::Message::~Message(&local_fc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
  return;
}

Assistant:

inline TestUtil::ReflectionTester::ReflectionTester(
    const Descriptor* base_descriptor)
    : base_descriptor_(base_descriptor) {
  const DescriptorPool* pool = base_descriptor->file()->pool();
  const absl::string_view package = base_descriptor->file()->package();
  const FieldDescriptor* import_descriptor = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.optional_import_message"));
  const absl::string_view import_package =
      import_descriptor->message_type()->file()->package();

  nested_b_ = pool->FindFieldByName(
      absl::StrCat(package, ".TestAllTypes.NestedMessage.bb"));
  foreign_c_ =
      pool->FindFieldByName(absl::StrCat(package, ".ForeignMessage.c"));
  import_d_ =
      pool->FindFieldByName(absl::StrCat(import_package, ".ImportMessage.d"));
  import_e_ = pool->FindFieldByName(
      absl::StrCat(import_package, ".PublicImportMessage.e"));
  nested_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.FOO"));
  nested_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAR"));
  nested_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".TestAllTypes.BAZ"));
  foreign_foo_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_FOO"));
  foreign_bar_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAR"));
  foreign_baz_ =
      pool->FindEnumValueByName(absl::StrCat(package, ".FOREIGN_BAZ"));
  import_foo_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_FOO"));
  import_bar_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAR"));
  import_baz_ =
      pool->FindEnumValueByName(absl::StrCat(import_package, ".IMPORT_BAZ"));

  if (base_descriptor_->name() == "TestAllExtensions") {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".OptionalGroup_extension.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".RepeatedGroup_extension.a"));
  } else {
    group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.OptionalGroup.a"));
    repeated_group_a_ = pool->FindFieldByName(
        absl::StrCat(package, ".TestAllTypes.RepeatedGroup.a"));
  }

  EXPECT_TRUE(group_a_ != nullptr);
  EXPECT_TRUE(repeated_group_a_ != nullptr);
  EXPECT_TRUE(nested_b_ != nullptr);
  EXPECT_TRUE(foreign_c_ != nullptr);
  EXPECT_TRUE(import_d_ != nullptr);
  EXPECT_TRUE(import_e_ != nullptr);
  EXPECT_TRUE(nested_foo_ != nullptr);
  EXPECT_TRUE(nested_bar_ != nullptr);
  EXPECT_TRUE(nested_baz_ != nullptr);
  EXPECT_TRUE(foreign_foo_ != nullptr);
  EXPECT_TRUE(foreign_bar_ != nullptr);
  EXPECT_TRUE(foreign_baz_ != nullptr);
  EXPECT_TRUE(import_foo_ != nullptr);
  EXPECT_TRUE(import_bar_ != nullptr);
  EXPECT_TRUE(import_baz_ != nullptr);
}